

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

Abc_Obj_t * Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *pOrigObj)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  MinRegMan_t *pMVar6;
  Abc_Obj_t *pInit;
  NodeLag_t *pNVar7;
  int *piVar8;
  Abc_Obj_t *pAVar9;
  uint uVar10;
  int iVar11;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar12;
  undefined8 extraout_RDX_03;
  int iVar13;
  long lVar14;
  
  if (pOrigObj == (Abc_Obj_t *)0x0) {
    __assert_fail("pOrigObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x343,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  uVar10 = *(uint *)&pOrigObj->field_0x14 & 0xf;
  if (uVar10 == 3) {
    __assert_fail("!Abc_ObjIsPo(pOrigObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x347,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  if (uVar10 == 2) {
    __assert_fail("!Abc_ObjIsPi(pOrigObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x346,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  if ((pManMR->pDataArray[(uint)pOrigObj->Id].field_0x1 & 1) == 0) {
    if ((*(uint *)&pOrigObj->field_0x14 & 0x10) == 0) {
      pInit = Abc_FlowRetime_CopyNodeToInitNtk(pOrigObj);
      pMVar6 = pManMR;
      iVar2 = pInit->Id;
      iVar13 = pManMR->sizeInitToOrig;
      uVar12 = extraout_RDX;
      if (iVar13 <= iVar2) {
        iVar11 = (int)((double)iVar2 * 1.5 + 10.0);
        pManMR->sizeInitToOrig = iVar11;
        pNVar7 = (NodeLag_t *)realloc(pMVar6->pInitToOrig,(long)iVar11 << 3);
        pMVar6 = pManMR;
        pManMR->pInitToOrig = pNVar7;
        memset(pNVar7 + iVar13,0,((long)pMVar6->sizeInitToOrig - (long)iVar13) * 8);
        uVar12 = extraout_RDX_00;
      }
      if (pManMR->pInitToOrig == (NodeLag_t *)0x0) {
        __assert_fail("pManMR->pInitToOrig",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x511,"void Abc_FlowRetime_SetInitToOrig(Abc_Obj_t *, Abc_Obj_t *)");
      }
      uVar10 = *(uint *)&pOrigObj->field_0x14 & 0xf;
      if ((uVar10 < 9) && ((0x130U >> uVar10 & 1) != 0)) {
        Abc_FlowRetime_ClearInitToOrig(pInit);
      }
      else {
        pAVar4 = pOrigObj->pNtk;
        if ((pAVar4->vTravIds).pArray == (int *)0x0) {
          iVar13 = pAVar4->vObjs->nSize;
          uVar1 = (long)iVar13 + 500;
          iVar11 = (int)uVar1;
          if ((pAVar4->vTravIds).nCap < iVar11) {
            piVar8 = (int *)malloc(uVar1 * 4);
            (pAVar4->vTravIds).pArray = piVar8;
            if (piVar8 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            (pAVar4->vTravIds).nCap = iVar11;
            uVar12 = extraout_RDX_01;
          }
          if (-500 < iVar13) {
            memset((pAVar4->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
            uVar12 = extraout_RDX_02;
          }
          (pAVar4->vTravIds).nSize = iVar11;
        }
        iVar13 = pAVar4->nTravIds;
        pAVar4->nTravIds = iVar13 + 1;
        if (0x3ffffffe < iVar13) {
          __assert_fail("p->nTravIds < (1<<30)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
        }
        iVar13 = 0;
        pAVar9 = pOrigObj;
        while( true ) {
          uVar10 = *(uint *)&pAVar9->field_0x14 & 0xf;
          if ((8 < uVar10) || ((0x130U >> uVar10 & 1) == 0)) goto LAB_004d4802;
          if ((pAVar9->vFanins).nSize == 0) {
            __assert_fail("Abc_ObjFaninNum(*pResult)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                          ,0x6b,"int Abc_FlowRetime_ObjFirstNonLatchBox(Abc_Obj_t *, Abc_Obj_t **)")
            ;
          }
          pAVar9 = (Abc_Obj_t *)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray];
          pAVar4 = pAVar9->pNtk;
          iVar11 = pAVar9->Id;
          Vec_IntFillExtra(&pAVar4->vTravIds,iVar11 + 1,(int)uVar12);
          if (((long)iVar11 < 0) || ((pAVar4->vTravIds).nSize <= iVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pAVar5 = pAVar9->pNtk;
          iVar3 = pAVar5->nTravIds;
          if ((pAVar4->vTravIds).pArray[iVar11] == iVar3) break;
          iVar11 = pAVar9->Id;
          Vec_IntFillExtra(&pAVar5->vTravIds,iVar11 + 1,Fill);
          if (((long)iVar11 < 0) || ((pAVar5->vTravIds).nSize <= iVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pAVar5->vTravIds).pArray[iVar11] = iVar3;
          iVar13 = iVar13 + (uint)((*(uint *)&pAVar9->field_0x14 & 0xf) == 8);
          uVar12 = extraout_RDX_03;
        }
        iVar13 = -1;
LAB_004d4802:
        pManMR->pInitToOrig[iVar2].id = pAVar9->Id;
        iVar11 = Abc_FlowRetime_GetLag(pAVar9);
        pManMR->pInitToOrig[iVar2].lag = iVar11 + iVar13;
      }
      pManMR->pDataArray[(uint)pOrigObj->Id].field_1.pred = pInit;
      pOrigObj->field_0x14 = pOrigObj->field_0x14 | 0x10;
    }
    else {
      pInit = pManMR->pDataArray[(uint)pOrigObj->Id].field_1.pred;
    }
    if (pInit == (Abc_Obj_t *)0x0) {
      __assert_fail("pInitObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x359,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
    }
    if ((pOrigObj->field_0x14 & 0x20) == 0) {
      if (0 < (pOrigObj->vFanins).nSize) {
        lVar14 = 0;
        do {
          pAVar9 = (Abc_Obj_t *)pOrigObj->pNtk->vObjs->pArray[(pOrigObj->vFanins).pArray[lVar14]];
          if ((*(uint *)&pAVar9->field_0x14 & 0xf) == 5) {
            __assert_fail("!Abc_ObjIsBo( pOrigFanin )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                          ,0x362,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
          }
          pAVar9 = Abc_FlowRetime_UpdateBackwardInit_rec(pAVar9);
          Abc_ObjAddFanin(pInit,pAVar9);
          lVar14 = lVar14 + 1;
        } while (lVar14 < (pOrigObj->vFanins).nSize);
      }
      pOrigObj->field_0x14 = pOrigObj->field_0x14 | 0x20;
    }
  }
  else {
    pInit = (Abc_Obj_t *)0x0;
  }
  return pInit;
}

Assistant:

Abc_Obj_t* Abc_FlowRetime_UpdateBackwardInit_rec( Abc_Obj_t *pOrigObj) {
  Abc_Obj_t *pOrigFanin, *pInitFanin, *pInitObj;
  int i;

  assert(pOrigObj);

  // should never reach primary IOs
  assert(!Abc_ObjIsPi(pOrigObj));
  assert(!Abc_ObjIsPo(pOrigObj));

  // skip bias nodes
  if (FTEST(pOrigObj, BIAS_NODE)) 
    return NULL;

  // does an init node already exist?
  if(!pOrigObj->fMarkA) {

    pInitObj = Abc_FlowRetime_CopyNodeToInitNtk( pOrigObj );

    Abc_FlowRetime_SetInitToOrig( pInitObj, pOrigObj );
    FDATA(pOrigObj)->pInitObj = pInitObj;

    pOrigObj->fMarkA = 1;
  } else {
    pInitObj = FDATA(pOrigObj)->pInitObj;
  }
  assert(pInitObj);
    
  // have we already connected this object?
  if (!pOrigObj->fMarkB) {

    // create and/or connect fanins
    Abc_ObjForEachFanin( pOrigObj, pOrigFanin, i ) {
      // should not reach BOs (i.e. the start of the next frame)
      // the new latch bounday should lie before it
      assert(!Abc_ObjIsBo( pOrigFanin ));
      pInitFanin = Abc_FlowRetime_UpdateBackwardInit_rec( pOrigFanin );
      Abc_ObjAddFanin( pInitObj, pInitFanin );
    }

    pOrigObj->fMarkB = 1;
  }

  return pInitObj;
}